

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::unique_ptr<int,std::default_delete<int>>const&,std::unique_ptr<int,std::default_delete<int>>const&,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&,int>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          unique_ptr<int,_std::default_delete<int>_> *args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args_2,
          int *args_3)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  int *piVar2;
  int *piVar3;
  undefined4 uVar4;
  Queue *pQVar5;
  void *result;
  _Rb_tree_node_base *p_Var6;
  size_t sVar7;
  char *pcVar8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long local_68 [2];
  uint local_58;
  undefined4 uStack_54;
  uint uStack_50;
  undefined4 uStack_4c;
  long local_48;
  undefined8 local_40;
  
  local_68[0] = 8;
  local_68[1] = 8;
  piVar2 = (args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  piVar3 = (args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar10 = -(uint)((int)piVar3 == 0 && (int)((ulong)piVar3 >> 0x20) == 0);
  uVar11 = -(uint)((int)piVar2 == 0 && (int)((ulong)piVar2 >> 0x20) == 0);
  local_58 = uVar10 & 1 | ~uVar10 & 5;
  uStack_54 = 0;
  uStack_50 = uVar11 & 1 | ~uVar11 & 5;
  uStack_4c = 0;
  p_Var6 = (args_2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar9 = 4;
  while ((_Rb_tree_header *)p_Var6 != &(args_2->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    lVar9 = lVar9 + 8;
  }
  local_48 = lVar9;
  local_40 = 4;
  lVar9 = 0;
  lVar12 = 0;
  lVar13 = 0;
  do {
    lVar12 = lVar12 + local_68[lVar9];
    lVar13 = lVar13 + local_68[lVar9 + 1];
    lVar9 = lVar9 + 2;
  } while (lVar9 != 6);
  minQueueCapacity = lVar13 + lVar12 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar7 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar7 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar13 + lVar12);
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + 4;
  *(uint64_t *)(pcVar8 + 4) = eventSourceId;
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + 8;
  *(uint64_t *)(pcVar8 + 8) = clock;
  pcVar8 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar8;
  if ((args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar8 = '\0';
    lVar9 = 1;
  }
  else {
    *pcVar8 = '\x01';
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 1;
    *(int *)(pcVar8 + 1) =
         *(args->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar9 = 4;
  }
  pcVar8 = (this->_qw)._writePos + lVar9;
  (this->_qw)._writePos = pcVar8;
  if ((args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl == (int *)0x0) {
    *pcVar8 = '\0';
    lVar9 = 1;
  }
  else {
    *pcVar8 = '\x01';
    pcVar8 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar8 + 1;
    *(int *)(pcVar8 + 1) =
         *(args_1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl;
    lVar9 = 4;
  }
  pcVar8 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar8 + lVar9;
  uVar4 = (undefined4)(args_2->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(pcVar8 + lVar9) = uVar4;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args_2,uVar4,this_00);
  *(int *)(this->_qw)._writePos = *args_3;
  pQVar5 = (this->_qw)._queue;
  pcVar8 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar8;
  (pQVar5->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar8 - (long)pQVar5->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}